

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O2

void i_number_suite::i_number_too_big_pos_int(void)

{
  undefined4 local_19c;
  view_type local_198 [2];
  char input [22];
  reader reader;
  
  builtin_strncpy(input,"100000000000000000000",0x16);
  local_198[0]._M_len = strlen(input);
  local_198[0]._M_str = input;
  trial::protocol::json::basic_reader<char>::basic_reader(&reader,local_198);
  local_198[0]._M_len = CONCAT44(local_198[0]._M_len._4_4_,reader.decoder.current.code);
  local_19c = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x6b,"void i_number_suite::i_number_too_big_pos_int()",local_198,&local_19c);
  local_198[0]._M_len =
       (long)reader.decoder.current.view.tail - (long)reader.decoder.current.view.head;
  local_198[0]._M_str = reader.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[22]>
            ("reader.literal()","\"100000000000000000000\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x6c,"void i_number_suite::i_number_too_big_pos_int()",local_198,
             "100000000000000000000");
  trial::protocol::json::basic_reader<char>::overloader<unsigned_long_long,_void>::value(&reader);
  boost::detail::throw_failed_impl
            ("reader.value<unsigned long long int>()","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x70,"void i_number_suite::i_number_too_big_pos_int()");
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&reader.stack);
  return;
}

Assistant:

void i_number_too_big_pos_int()
{
    const char input[] = "100000000000000000000";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "100000000000000000000");
    // Cannot be represented by integers
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<unsigned long long int>(),
                                    json::error,
                                    "invalid value");
}